

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify-walker-impl.h
# Opt level: O2

void __thiscall
wasm::StringifyWalker<wasm::HashStringifyWalker>::dequeueControlFlow
          (StringifyWalker<wasm::HashStringifyWalker> *this)

{
  Id IVar1;
  Expression *this_00;
  ArenaVector<wasm::Expression_*> *pAVar2;
  SeparatorReason SVar3;
  SeparatorReason SVar4;
  SeparatorReason SVar5;
  SeparatorReason SVar6;
  SeparatorReason SVar7;
  SeparatorReason SVar8;
  SeparatorReason SVar9;
  SeparatorReason SVar10;
  SeparatorReason SVar11;
  Try *pTVar12;
  Expression **ppEVar13;
  Block *pBVar14;
  If *pIVar15;
  HashStringifyWalker *self;
  undefined1 in_stack_00000008 [16];
  _Variadic_union<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
  in_stack_ffffffffffffffb8;
  ArenaVector<wasm::Expression_*> *in_stack_ffffffffffffffc0;
  ArenaVector<wasm::Expression_*> *pAVar16;
  Iterator __begin3;
  
  this_00 = *(this->controlFlowQueue).c.
             super__Deque_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
  std::deque<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::pop_front
            (&(this->controlFlowQueue).c);
  IVar1 = this_00->_id;
  if (IVar1 == BlockId) {
    pBVar14 = Expression::cast<wasm::Block>(this_00);
    SVar9.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    ._8_8_ = in_stack_ffffffffffffffc0;
    SVar9.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    ._M_u = in_stack_ffffffffffffffb8;
    ::wasm::HashStringifyWalker::addUniqueSymbol(SVar9);
    __begin3.parent = (ArenaVector<wasm::Expression_*> *)0x0;
    pAVar2 = *(ArenaVector<wasm::Expression_*> **)(pBVar14 + 0x28);
    pAVar16 = (ArenaVector<wasm::Expression_*> *)(pBVar14 + 0x20);
    while ((__begin3.parent != pAVar2 ||
           (pAVar16 != (ArenaVector<wasm::Expression_*> *)(pBVar14 + 0x20)))) {
      ppEVar13 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                 operator*((Iterator *)&stack0xffffffffffffffc0);
      Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
      ::walk((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
              *)this,ppEVar13);
      __begin3.parent =
           (ArenaVector<wasm::Expression_*> *)
           ((long)&((__begin3.parent)->
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data
           + 1);
    }
    SVar10.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    ._8_8_ = pAVar16;
    SVar10.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    ._M_u = in_stack_ffffffffffffffb8;
    ::wasm::HashStringifyWalker::addUniqueSymbol(SVar10);
    return;
  }
  if (IVar1 == IfId) {
    pIVar15 = Expression::cast<wasm::If>(this_00);
    SVar7.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    ._8_8_ = in_stack_ffffffffffffffc0;
    SVar7.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    ._M_u = in_stack_ffffffffffffffb8;
    ::wasm::HashStringifyWalker::addUniqueSymbol(SVar7);
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::walk((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
            *)this,(Expression **)(pIVar15 + 0x18));
    if (*(long *)(pIVar15 + 0x20) == 0) goto LAB_001d5503;
    SVar8.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    ._8_8_ = in_stack_ffffffffffffffc0;
    SVar8.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    ._M_u = in_stack_ffffffffffffffb8;
    ::wasm::HashStringifyWalker::addUniqueSymbol(SVar8);
  }
  else {
    if (IVar1 != LoopId) {
      if (IVar1 == TryId) {
        pTVar12 = Expression::cast<wasm::Try>(this_00);
        SVar3.reason.
        super__Variant_base<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Move_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Copy_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Move_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Copy_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Variant_storage_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        ._8_8_ = in_stack_ffffffffffffffc0;
        SVar3.reason.
        super__Variant_base<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Move_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Copy_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Move_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Copy_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Variant_storage_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        ._M_u = in_stack_ffffffffffffffb8;
        ::wasm::HashStringifyWalker::addUniqueSymbol(SVar3);
        Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
        ::walk((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)this,&pTVar12->body);
        SVar4.reason.
        super__Variant_base<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Move_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Copy_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Move_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Copy_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Variant_storage_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        ._8_8_ = in_stack_ffffffffffffffc0;
        SVar4.reason.
        super__Variant_base<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Move_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Copy_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Move_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Copy_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Variant_storage_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        ._M_u = in_stack_ffffffffffffffb8;
        ::wasm::HashStringifyWalker::addUniqueSymbol(SVar4);
        __begin3.parent = (ArenaVector<wasm::Expression_*> *)0x0;
        pAVar2 = (ArenaVector<wasm::Expression_*> *)
                 (pTVar12->catchBodies).
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                 usedElements;
        pAVar16 = &pTVar12->catchBodies;
        while ((__begin3.parent != pAVar2 || (pAVar16 != &pTVar12->catchBodies))) {
          ppEVar13 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator
                     ::operator*((Iterator *)&stack0xffffffffffffffc0);
          SVar5.reason.
          super__Variant_base<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
          .
          super__Move_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
          .
          super__Copy_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
          .
          super__Move_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
          .
          super__Copy_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
          .
          super__Variant_storage_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
          ._8_8_ = pAVar16;
          SVar5.reason.
          super__Variant_base<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
          .
          super__Move_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
          .
          super__Copy_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
          .
          super__Move_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
          .
          super__Copy_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
          .
          super__Variant_storage_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
          ._M_u = in_stack_ffffffffffffffb8;
          ::wasm::HashStringifyWalker::addUniqueSymbol(SVar5);
          Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
          ::walk((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                  *)this,ppEVar13);
          SVar6.reason.
          super__Variant_base<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
          .
          super__Move_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
          .
          super__Copy_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
          .
          super__Move_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
          .
          super__Copy_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
          .
          super__Variant_storage_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
          ._8_8_ = pAVar16;
          SVar6.reason.
          super__Variant_base<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
          .
          super__Move_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
          .
          super__Copy_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
          .
          super__Move_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
          .
          super__Copy_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
          .
          super__Variant_storage_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
          ._M_u = in_stack_ffffffffffffffb8;
          ::wasm::HashStringifyWalker::addUniqueSymbol(SVar6);
          __begin3.parent =
               (ArenaVector<wasm::Expression_*> *)
               ((long)&((__begin3.parent)->
                       super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                       data + 1);
        }
        return;
      }
      if (IVar1 != TryTableId) {
        __assert_fail("Properties::isControlFlowStructure(curr)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/stringify-walker-impl.h"
                      ,0x76,
                      "void wasm::StringifyWalker<wasm::HashStringifyWalker>::dequeueControlFlow() [SubType = wasm::HashStringifyWalker]"
                     );
      }
      ::wasm::handle_unreachable
                ("unexpected expression",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/stringify-walker-impl.h"
                 ,0x77);
    }
    pIVar15 = (If *)Expression::cast<wasm::Loop>(this_00);
    SVar11.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    ._8_8_ = in_stack_ffffffffffffffc0;
    SVar11.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    ._M_u = in_stack_ffffffffffffffb8;
    ::wasm::HashStringifyWalker::addUniqueSymbol(SVar11);
  }
  Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
  ::walk((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
          *)this,(Expression **)(pIVar15 + 0x20));
LAB_001d5503:
  ::wasm::HashStringifyWalker::addUniqueSymbol((SeparatorReason)in_stack_00000008);
  return;
}

Assistant:

void StringifyWalker<SubType>::dequeueControlFlow() {
  auto& queue = controlFlowQueue;
  Expression* curr = queue.front();
  queue.pop();
  DBG(std::cerr << "controlFlowQueue.pop: " << ShallowExpression{curr} << ", "
                << curr << "\n");

  // TODO: Issue #5796, Make a ControlChildIterator
  switch (curr->_id) {
    case Expression::Id::BlockId: {
      auto* block = curr->cast<Block>();
      addUniqueSymbol(SeparatorReason::makeBlockStart(block));
      for (auto& child : block->list) {
        Super::walk(child);
      }
      addUniqueSymbol(SeparatorReason::makeEnd());
      break;
    }
    case Expression::Id::IfId: {
      auto* iff = curr->cast<If>();
      addUniqueSymbol(SeparatorReason::makeIfStart(iff));
      Super::walk(iff->ifTrue);
      if (iff->ifFalse) {
        addUniqueSymbol(SeparatorReason::makeElseStart());
        Super::walk(iff->ifFalse);
      }
      addUniqueSymbol(SeparatorReason::makeEnd());
      break;
    }
    case Expression::Id::TryId: {
      auto* tryy = curr->cast<Try>();
      addUniqueSymbol(SeparatorReason::makeTryBodyStart());
      Super::walk(tryy->body);
      addUniqueSymbol(SeparatorReason::makeEnd());
      for (auto& child : tryy->catchBodies) {
        addUniqueSymbol(SeparatorReason::makeTryCatchStart());
        Super::walk(child);
        addUniqueSymbol(SeparatorReason::makeEnd());
      }
      break;
    }
    case Expression::Id::LoopId: {
      auto* loop = curr->cast<Loop>();
      addUniqueSymbol(SeparatorReason::makeLoopStart(loop));
      Super::walk(loop->body);
      addUniqueSymbol(SeparatorReason::makeEnd());
      break;
    }
    default: {
      assert(Properties::isControlFlowStructure(curr));
      WASM_UNREACHABLE("unexpected expression");
    }
  }
}